

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenerContainerTest.cpp
# Opt level: O3

int main(void)

{
  Foo *this;
  FooListener *listener;
  int i_1;
  int iVar1;
  int i_2;
  ulong uVar2;
  int i;
  long lVar3;
  Cat *kittens [4];
  Invoker local_60;
  Foo *local_58;
  int local_50;
  undefined8 auStack_48 [4];
  
  this = (Foo *)operator_new(8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/listenerContainerTest.cpp"
                             ,0x83);
  Foo::Foo(this);
  lVar3 = 0;
  do {
    listener = (FooListener *)
               operator_new(0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/listenerContainerTest.cpp"
                            ,0x87);
    listener->_vptr_FooListener = (_func_int **)&PTR_onFoo_00104ce0;
    *(int *)&listener[1]._vptr_FooListener = (int)lVar3;
    auStack_48[lVar3] = listener;
    ListenerContainer<FooListener>::addListener(this->mListeners,listener);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  getchar();
  iVar1 = 10;
  do {
    local_60._vptr_Invoker = (_func_int **)&PTR_operator___00104d28;
    local_58 = this;
    local_50 = iVar1;
    ListenerContainer<FooListener>::invokeListeners(this->mListeners,&local_60);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0xe);
  getchar();
  local_60._vptr_Invoker = (_func_int **)&PTR_operator___00104d78;
  local_58 = this;
  ListenerContainer<FooListener>::invokeListeners(this->mListeners,&local_60);
  uVar2 = 0;
  do {
    if ((uVar2 & 1) == 0) {
      ListenerContainer<FooListener>::removeListener
                (this->mListeners,(FooListener *)auStack_48[uVar2]);
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 4);
  getchar();
  local_60._vptr_Invoker = (_func_int **)&PTR_operator___00104d28;
  local_50 = 10;
  local_58 = this;
  ListenerContainer<FooListener>::invokeListeners(this->mListeners,&local_60);
  getchar();
  local_60._vptr_Invoker = (_func_int **)&PTR_operator___00104d78;
  local_58 = this;
  ListenerContainer<FooListener>::invokeListeners(this->mListeners,&local_60);
  return 0;
}

Assistant:

int main()
{
	Cat *kittens[4];
	Foo *foo = jh_new Foo();
	
	for (int i = 0; i < 4; ++i)
	{
		kittens[i] = jh_new Cat(i);
		foo->addListener(kittens[i]);
	}
	
	LOG_NOTICE("Try some foo");
	getchar();
	
	for (int i = 10; i < 14; ++i)
		foo->DoFoo(i);
	
	LOG_NOTICE("Try some bar");
	getchar();
	
	for (int i = 0; i < 2; ++i);
		foo->DoBar();

	LOG_NOTICE("Remove some listeners");
	for (int i = 0; i < 4; ++i)
	{
		if (i%2 == 0)
			foo->removeListener(kittens[i]);
	}
	
	LOG_NOTICE("Try some foo");
	getchar();
	
	for (int i = 10; i < 11; ++i)
		foo->DoFoo(i);
	
	LOG_NOTICE("Try some bar");
	getchar();
	
	for (int i = 0; i < 2; ++i);
		foo->DoBar();
}